

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

void __thiscall Bstrlib::CBString::repeat(CBString *this,int count)

{
  int iVar1;
  CBStringException *this_00;
  double in_XMM0_Qa;
  allocator local_61;
  string local_60;
  undefined1 local_40 [8];
  CBStringException bstr__cppwrapper_exception;
  int count_local;
  CBString *this_local;
  
  bstr__cppwrapper_exception.msg.field_2._12_4_ = (this->super_tagbstring).slen * count;
  if (bstr__cppwrapper_exception.msg.field_2._12_4_ == 0) {
    trunc(this,in_XMM0_Qa);
    return;
  }
  if ((-1 < (int)bstr__cppwrapper_exception.msg.field_2._12_4_) &&
     (iVar1 = bpattern(&this->super_tagbstring,bstr__cppwrapper_exception.msg.field_2._12_4_),
     iVar1 != -1)) {
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CBString::Failure in repeat",&local_61);
  CBStringException::CBStringException((CBStringException *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,(CBStringException *)local_40);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBString::repeat (int count) {
	count *= slen;
	if (count == 0) {
		trunc (0);
		return;
	}
	if (count < 0 || BSTR_ERR == bpattern (this, count)) {
		bstringThrow ("Failure in repeat");
	}
}